

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdom.cpp
# Opt level: O1

int __thiscall
QDomNamedNodeMapPrivate::clone
          (QDomNamedNodeMapPrivate *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  ulong uVar1;
  QDomNamedNodeMapPrivate *this_00;
  QDomNodePrivate *arg;
  ulong uVar2;
  uchar *puVar3;
  Data *pDVar4;
  
  this_00 = (QDomNamedNodeMapPrivate *)operator_new(0x28);
  (this_00->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i = 1;
  (this_00->map).d = (Data *)0x0;
  (this_00->map).m_size = 0;
  this_00->parent = (QDomNodePrivate *)__fn;
  this_00->readonly = false;
  this_00->appendToParent = false;
  this_00->readonly = this->readonly;
  this_00->appendToParent = this->appendToParent;
  pDVar4 = (this->map).d;
  if (pDVar4 == (Data *)0x0) {
    pDVar4 = (Data *)0x0;
    uVar2 = 0;
    goto LAB_001104f3;
  }
  if (pDVar4->spans->offsets[0] != 0xff) goto LAB_001104b5;
  uVar1 = 1;
  do {
    uVar2 = uVar1;
    if (pDVar4->numBuckets == uVar2) {
      pDVar4 = (Data *)0x0;
      uVar2 = 0;
      break;
    }
    uVar1 = uVar2 + 1;
  } while (pDVar4->spans[uVar2 >> 7].offsets[(uint)uVar2 & 0x7f] == 0xff);
LAB_001104b8:
  do {
    if (pDVar4 == (Data *)0x0) {
LAB_001104f3:
      puVar3 = (uchar *)0x0;
    }
    else {
      puVar3 = pDVar4->spans[uVar2 >> 7].entries
               [pDVar4->spans[uVar2 >> 7].offsets[(uint)uVar2 & 0x7f]].storage.data + 0x18;
    }
    while( true ) {
      if (puVar3 == (uchar *)0x0) {
        LOCK();
        (this_00->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
        super___atomic_base<int>._M_i =
             (this_00->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
             super___atomic_base<int>._M_i + -1;
        UNLOCK();
        return (int)this_00;
      }
      arg = (QDomNodePrivate *)
            (**(code **)(*(long *)**(undefined8 **)puVar3 + 0x40))
                      ((long *)**(undefined8 **)puVar3,1);
      arg->ownerNode = (QDomNodePrivate *)__fn;
      arg->field_0x98 = arg->field_0x98 | 2;
      setNamedItem(this_00,arg);
      if (*(long *)(*(long *)puVar3 + 8) == 0) break;
      puVar3 = (uchar *)(*(long *)puVar3 + 8);
    }
    while (pDVar4->numBuckets - 1 != uVar2) {
      uVar2 = uVar2 + 1;
      if (pDVar4->spans[uVar2 >> 7].offsets[(uint)uVar2 & 0x7f] != 0xff) goto LAB_001104b8;
    }
    pDVar4 = (Data *)0x0;
LAB_001104b5:
    uVar2 = 0;
  } while( true );
}

Assistant:

QDomNamedNodeMapPrivate* QDomNamedNodeMapPrivate::clone(QDomNodePrivate *pimpl)
{
    std::unique_ptr<QDomNamedNodeMapPrivate> m(new QDomNamedNodeMapPrivate(pimpl));
    m->readonly = readonly;
    m->appendToParent = appendToParent;

    auto it = map.constBegin();
    for (; it != map.constEnd(); ++it) {
        QDomNodePrivate *new_node = it.value()->cloneNode();
        new_node->setParent(pimpl);
        m->setNamedItem(new_node);
    }

    // we are no longer interested in ownership
    m->ref.deref();
    return m.release();
}